

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O1

void __thiscall QCborStreamReader::preparse(QCborStreamReader *this)

{
  QCborStreamReader QVar1;
  byte bVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  plVar4 = *(long **)(this + 8);
  if ((int)plVar4[0xc] == 0) {
    QVar1 = *(QCborStreamReader *)((long)plVar4 + 0x5e);
    this[0x10] = QVar1;
    if (QVar1 == (QCborStreamReader)0xff) {
      if ((*plVar4 != 0) && (plVar4[6] == 0)) {
        QByteArray::clear((QByteArray *)(plVar4 + 1));
        lVar5 = (*(undefined8 **)(this + 8))[0xd];
        if (lVar5 != 0) {
          QIODevice::skip((QIODevice *)**(undefined8 **)(this + 8),lVar5);
        }
        *(undefined8 *)(*(long *)(this + 8) + 0x68) = 0;
      }
    }
    else {
      *(undefined4 *)(plVar4 + 0xc) = 0;
      if ((byte)((char)QVar1 + 0xbU) < 3) {
        this[0x10] = (QCborStreamReader)0xe0;
        *(ulong *)this = (ulong)*(byte *)(plVar4[2] + plVar4[0xd]) - 0xe0;
      }
      else {
        bVar2 = *(byte *)((long)plVar4 + 0x5f);
        if ((bVar2 & 2) == 0) {
          uVar7 = (ulong)*(ushort *)((long)plVar4 + 0x5c);
        }
        else {
          lVar5 = *(long *)(plVar4[10] + 0x10);
          lVar6 = *(long *)(plVar4[10] + 0x68);
          if ((bVar2 & 1) == 0) {
            uVar3 = *(uint *)(lVar5 + 1 + lVar6);
            uVar7 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18);
          }
          else {
            uVar7 = *(ulong *)(lVar5 + 1 + lVar6);
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
          }
        }
        *(ulong *)this = uVar7;
        if ((bVar2 & 4) != 0 && QVar1 == (QCborStreamReader)0x0) {
          this[0x10] = (QCborStreamReader)0x20;
        }
      }
    }
  }
  else {
    this[0x10] = (QCborStreamReader)0xff;
  }
  return;
}

Assistant:

inline void QCborStreamReader::preparse()
{
    if (lastError() == QCborError::NoError) {
        type_ = cbor_value_get_type(&d->currentElement);

        if (type_ == CborInvalidType) {
            // We may have reached the end.
            if (d->device && d->containerStack.isEmpty()) {
                d->buffer.clear();
                if (d->bufferStart)
                    d->device->skip(d->bufferStart);
                d->bufferStart = 0;
            }
        } else {
            d->lastError = {};
            // Undo the type mapping that TinyCBOR does (we have an explicit type
            // for negative integer and we don't have separate types for Boolean,
            // Null and Undefined).
            if (type_ == CborBooleanType || type_ == CborNullType || type_ == CborUndefinedType) {
                type_ = CborSimpleType;
                value64 = quint8(d->buffer.at(d->bufferStart)) - CborSimpleType;
            } else {
                // Using internal TinyCBOR API!
                value64 = _cbor_value_extract_int64_helper(&d->currentElement);

                if (cbor_value_is_negative_integer(&d->currentElement))
                    type_ = quint8(QCborStreamReader::NegativeInteger);
            }
        }
    } else {
        type_ = Invalid;
    }
}